

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool __thiscall cmSystemTools::EnvDiff::ParseOperation(EnvDiff *this,string *envmod)

{
  _Alloc_hider _Var1;
  size_type sVar2;
  int iVar3;
  long lVar4;
  iterator __position;
  optional<std::__cxx11::string> *this_00;
  mapped_type *pmVar5;
  long *plVar6;
  bool bVar7;
  size_type __rlen;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  anon_class_8_1_8991fb9c apply_diff;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> value;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> op;
  _Any_data local_f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e8;
  anon_class_8_1_8991fb9c local_c8;
  string local_c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  pointer local_48;
  undefined8 local_40;
  undefined8 local_38;
  undefined1 *local_30;
  undefined8 local_28;
  
  local_c8.this = this;
  lVar4 = std::__cxx11::string::find((char)envmod,0x3d);
  if (lVar4 == -1) {
    local_68._M_dataplus._M_p = (pointer)0x2f;
    local_68._M_string_length = 0x7f034a;
    local_68.field_2._M_allocated_capacity = 0;
    local_48 = (envmod->_M_dataplus)._M_p;
    local_68.field_2._8_8_ = envmod->_M_string_length;
    local_40 = 0;
    local_a0.field_2._M_allocated_capacity = (long)&local_a0.field_2 + 8;
    local_a0._M_dataplus._M_p = (pointer)0x0;
    local_a0._M_string_length = 1;
    local_a0.field_2._M_local_buf[8] = '\n';
    local_38 = 1;
    local_28 = 0;
    views._M_len = 3;
    views._M_array = (iterator)&local_68;
    local_30 = (undefined1 *)local_a0.field_2._M_allocated_capacity;
    cmCatViews(&local_c0,views);
    Error(&local_c0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  std::__cxx11::string::substr((ulong)&local_c0,(ulong)envmod);
  lVar4 = std::__cxx11::string::find((char)envmod,0x3a);
  if (lVar4 == -1) {
    local_68._M_dataplus._M_p = (pointer)0x2b;
    local_68._M_string_length = 0x7f037a;
    local_68.field_2._M_allocated_capacity = 0;
    local_48 = (envmod->_M_dataplus)._M_p;
    local_68.field_2._8_8_ = envmod->_M_string_length;
    local_40 = 0;
    local_a0.field_2._M_allocated_capacity = (long)&local_a0.field_2 + 8;
    local_a0._M_dataplus._M_p = (pointer)0x0;
    local_a0._M_string_length = 1;
    local_a0.field_2._M_local_buf[8] = '\n';
    local_38 = 1;
    local_28 = 0;
    views_00._M_len = 3;
    views_00._M_array = (iterator)&local_68;
    local_30 = (undefined1 *)local_a0.field_2._M_allocated_capacity;
    cmCatViews((string *)&local_f8,views_00);
    Error((string *)&local_f8);
    if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
        local_f8._M_unused._0_8_ != &local_e8) {
      operator_delete(local_f8._M_unused._M_object,(ulong)(local_e8._M_dataplus._M_p + 1));
    }
    bVar7 = false;
    goto LAB_0023b1d0;
  }
  std::__cxx11::string::substr((ulong)&local_68,(ulong)envmod);
  std::__cxx11::string::substr((ulong)&local_a0,(ulong)envmod);
  sVar2 = local_68._M_string_length;
  _Var1._M_p = local_68._M_dataplus._M_p;
  if (((undefined1 *)local_68._M_string_length == &DAT_00000005) &&
     (iVar3 = bcmp(local_68._M_dataplus._M_p,"reset",5), iVar3 == 0)) {
    __position = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                         *)this,&local_c0);
    bVar7 = true;
    if ((_Rb_tree_header *)__position._M_node != &(this->diff)._M_t._M_impl.super__Rb_tree_header) {
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
      ::_M_erase_aux((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                      *)this,(const_iterator)__position._M_node);
    }
  }
  else if (((char *)sVar2 == (char *)0x3) && (iVar3 = bcmp(_Var1._M_p,"set",3), iVar3 == 0)) {
    this_00 = (optional<std::__cxx11::string> *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
              ::operator[](&this->diff,&local_c0);
    bVar7 = true;
    std::optional<std::__cxx11::string>::operator=(this_00,&local_a0);
  }
  else if (((undefined1 *)sVar2 == &DAT_00000005) &&
          (iVar3 = bcmp(_Var1._M_p,"unset",5), iVar3 == 0)) {
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
             ::operator[](&this->diff,&local_c0);
    bVar7 = true;
    if ((pmVar5->
        super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
        )._M_payload.
        super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
        .
        super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ._M_engaged == true) {
      (pmVar5->
      super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
      )._M_payload.
      super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
      .
      super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ._M_engaged = false;
      _Var1._M_p = (pmVar5->
                   super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                   )._M_payload.
                   super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                   .
                   super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   ._M_payload._M_value._M_dataplus._M_p;
      plVar6 = (long *)((long)&(pmVar5->
                               super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
                               )._M_payload.
                               super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
                               .
                               super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ._M_payload + 0x10);
      if ((long *)_Var1._M_p != plVar6) {
        operator_delete(_Var1._M_p,*plVar6 + 1);
      }
    }
  }
  else {
    if ((char *)sVar2 == (char *)0x10) {
      iVar3 = bcmp(_Var1._M_p,"path_list_append",0x10);
      if (iVar3 != 0) goto LAB_0023ad45;
      local_f8._8_8_ = 0x3a;
      local_e8._M_string_length =
           (size_type)
           std::
           _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1732:22)>
           ::_M_invoke;
      local_e8._M_dataplus._M_p =
           (pointer)std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1732:22)>
                    ::_M_manager;
      local_f8._M_unused._M_object = &local_a0;
      ParseOperation::anon_class_8_1_8991fb9c::operator()
                (&local_c8,&local_c0,
                 (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_f8);
      if ((code *)local_e8._M_dataplus._M_p != (code *)0x0) {
        (*(code *)local_e8._M_dataplus._M_p)(&local_f8,&local_f8,3);
      }
    }
    else if ((char *)sVar2 == (char *)0xe) {
      iVar3 = bcmp(_Var1._M_p,"string_prepend",0xe);
      if (iVar3 != 0) goto LAB_0023ad45;
      local_f8._8_8_ = 0;
      local_e8._M_string_length =
           (size_type)
           std::
           _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1730:16)>
           ::_M_invoke;
      local_e8._M_dataplus._M_p =
           (pointer)std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1730:16)>
                    ::_M_manager;
      local_f8._M_unused._M_object = &local_a0;
      ParseOperation::anon_class_8_1_8991fb9c::operator()
                (&local_c8,&local_c0,
                 (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_f8);
      if ((code *)local_e8._M_dataplus._M_p != (code *)0x0) {
        (*(code *)local_e8._M_dataplus._M_p)(&local_f8,&local_f8,3);
      }
    }
    else if (((char *)sVar2 == (char *)0xd) &&
            (iVar3 = bcmp(_Var1._M_p,"string_append",0xd), iVar3 == 0)) {
      local_f8._8_8_ = 0;
      local_e8._M_string_length =
           (size_type)
           std::
           _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1727:22)>
           ::_M_invoke;
      local_e8._M_dataplus._M_p =
           (pointer)std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1727:22)>
                    ::_M_manager;
      local_f8._M_unused._M_object = &local_a0;
      ParseOperation::anon_class_8_1_8991fb9c::operator()
                (&local_c8,&local_c0,
                 (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                  *)&local_f8);
      if ((code *)local_e8._M_dataplus._M_p != (code *)0x0) {
        (*(code *)local_e8._M_dataplus._M_p)(&local_f8,&local_f8,3);
      }
    }
    else {
LAB_0023ad45:
      if ((undefined1 *)sVar2 == &DAT_00000011) {
        iVar3 = bcmp(_Var1._M_p,"path_list_prepend",0x11);
        if (iVar3 == 0) {
          local_f8._8_8_ = 0x3a;
          local_e8._M_string_length =
               (size_type)
               std::
               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1739:22)>
               ::_M_invoke;
          local_e8._M_dataplus._M_p =
               (pointer)std::
                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1739:22)>
                        ::_M_manager;
          local_f8._M_unused._M_object = &local_a0;
          ParseOperation::anon_class_8_1_8991fb9c::operator()
                    (&local_c8,&local_c0,
                     (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_f8);
          if ((code *)local_e8._M_dataplus._M_p != (code *)0x0) {
            (*(code *)local_e8._M_dataplus._M_p)(&local_f8,&local_f8,3);
          }
        }
        else {
          iVar3 = bcmp(_Var1._M_p,"cmake_list_append",0x11);
          if (iVar3 != 0) goto LAB_0023ad85;
          local_f8._8_8_ = 0;
          local_e8._M_string_length =
               (size_type)
               std::
               _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1746:22)>
               ::_M_invoke;
          local_e8._M_dataplus._M_p =
               (pointer)std::
                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1746:22)>
                        ::_M_manager;
          local_f8._M_unused._M_object = &local_a0;
          ParseOperation::anon_class_8_1_8991fb9c::operator()
                    (&local_c8,&local_c0,
                     (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                      *)&local_f8);
          if ((code *)local_e8._M_dataplus._M_p != (code *)0x0) {
            (*(code *)local_e8._M_dataplus._M_p)(&local_f8,&local_f8,3);
          }
        }
      }
      else {
LAB_0023ad85:
        if (((char *)sVar2 != (char *)0x12) ||
           (iVar3 = bcmp(_Var1._M_p,"cmake_list_prepend",0x12), iVar3 != 0)) {
          local_e8.field_2._M_local_buf[0xf] = '\n';
          cmStrCat<char_const(&)[56],std::__cxx11::string_const&,char>
                    ((string *)&local_f8,
                     (char (*) [56])"Error: Unrecognized environment manipulation argument: ",
                     &local_68,local_e8.field_2._M_local_buf + 0xf);
          Error((string *)&local_f8);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
              local_f8._M_unused._0_8_ != &local_e8) {
            operator_delete(local_f8._M_unused._M_object,(ulong)(local_e8._M_dataplus._M_p + 1));
          }
          bVar7 = false;
          goto LAB_0023b194;
        }
        local_f8._8_8_ = 0;
        local_e8._M_string_length =
             (size_type)
             std::
             _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1753:22)>
             ::_M_invoke;
        local_e8._M_dataplus._M_p =
             (pointer)std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/JeremieA[P]CMake/Source/cmSystemTools.cxx:1753:22)>
                      ::_M_manager;
        local_f8._M_unused._M_object = &local_a0;
        ParseOperation::anon_class_8_1_8991fb9c::operator()
                  (&local_c8,&local_c0,
                   (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
                    *)&local_f8);
        if ((code *)local_e8._M_dataplus._M_p != (code *)0x0) {
          (*(code *)local_e8._M_dataplus._M_p)(&local_f8,&local_f8,3);
        }
      }
    }
    bVar7 = true;
  }
LAB_0023b194:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p,(ulong)(local_a0.field_2._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
LAB_0023b1d0:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
    operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
  }
  return bVar7;
}

Assistant:

bool cmSystemTools::EnvDiff::ParseOperation(const std::string& envmod)
{
  char path_sep = GetSystemPathlistSeparator();

  auto apply_diff = [this](const std::string& name,
                           std::function<void(std::string&)> const& apply) {
    cm::optional<std::string> old_value = diff[name];
    std::string output;
    if (old_value) {
      output = *old_value;
    } else {
      const char* curval = cmSystemTools::GetEnv(name);
      if (curval) {
        output = curval;
      }
    }
    apply(output);
    diff[name] = output;
  };

  // Split on `=`
  auto const eq_loc = envmod.find_first_of('=');
  if (eq_loc == std::string::npos) {
    cmSystemTools::Error(cmStrCat(
      "Error: Missing `=` after the variable name in: ", envmod, '\n'));
    return false;
  }

  auto const name = envmod.substr(0, eq_loc);

  // Split value on `:`
  auto const op_value_start = eq_loc + 1;
  auto const colon_loc = envmod.find_first_of(':', op_value_start);
  if (colon_loc == std::string::npos) {
    cmSystemTools::Error(
      cmStrCat("Error: Missing `:` after the operation in: ", envmod, '\n'));
    return false;
  }
  auto const op = envmod.substr(op_value_start, colon_loc - op_value_start);

  auto const value_start = colon_loc + 1;
  auto const value = envmod.substr(value_start);

  // Determine what to do with the operation.
  if (op == "reset"_s) {
    auto entry = diff.find(name);
    if (entry != diff.end()) {
      diff.erase(entry);
    }
  } else if (op == "set"_s) {
    diff[name] = value;
  } else if (op == "unset"_s) {
    diff[name] = cm::nullopt;
  } else if (op == "string_append"_s) {
    apply_diff(name, [&value](std::string& output) { output += value; });
  } else if (op == "string_prepend"_s) {
    apply_diff(name,
               [&value](std::string& output) { output.insert(0, value); });
  } else if (op == "path_list_append"_s) {
    apply_diff(name, [&value, path_sep](std::string& output) {
      if (!output.empty()) {
        output += path_sep;
      }
      output += value;
    });
  } else if (op == "path_list_prepend"_s) {
    apply_diff(name, [&value, path_sep](std::string& output) {
      if (!output.empty()) {
        output.insert(output.begin(), path_sep);
      }
      output.insert(0, value);
    });
  } else if (op == "cmake_list_append"_s) {
    apply_diff(name, [&value](std::string& output) {
      if (!output.empty()) {
        output += ';';
      }
      output += value;
    });
  } else if (op == "cmake_list_prepend"_s) {
    apply_diff(name, [&value](std::string& output) {
      if (!output.empty()) {
        output.insert(output.begin(), ';');
      }
      output.insert(0, value);
    });
  } else {
    cmSystemTools::Error(cmStrCat(
      "Error: Unrecognized environment manipulation argument: ", op, '\n'));
    return false;
  }

  return true;
}